

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_dead_code_elimination.cpp
# Opt level: O2

void __thiscall
optimization::complex_dce::ComplexDceRunner::calc_remained_vars(ComplexDceRunner *this)

{
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *this_00;
  key_type *pkVar1;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> _Var2;
  iterator iVar3;
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *__range3_1;
  byte bVar4;
  _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true> __tmp_1;
  _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true> __tmp;
  __node_base *p_Var5;
  _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true> __tmp_2;
  pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
  pVar6;
  __ireturn_type _Var7;
  __ireturn_type _Var8;
  VarId x;
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *__range3;
  deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> remaining;
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  visited;
  value_type local_100;
  __node_base *local_f0;
  __node_base *local_e8;
  _Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_e0;
  _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_d8;
  _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_d0;
  _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_c8;
  _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_c0;
  _Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_b8;
  _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  std::_Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::_Deque_base(&local_b8);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_e0 = (_Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&this->ref_vars;
  local_e8 = &(this->ref_vars)._M_h._M_before_begin;
  local_c0 = &(this->invert_dependance)._M_h;
  local_c8 = &(this->store_dependance)._M_h;
  this_00 = &this->do_not_delete;
  local_f0 = &(this->do_not_delete)._M_h._M_before_begin;
  local_d0 = &(this->var_dependance)._M_h;
  local_d8 = &(this->backup_ref_vars)._M_h;
  bVar4 = 1;
  while ((bVar4 & 1) != 0) {
    std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::clear
              ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b8);
    p_Var5 = local_e8;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      local_100.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_100.id = (uint32_t)((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
      std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b8,&local_100)
      ;
    }
    bVar4 = 0;
    while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_100.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_100.id = (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->id;
      std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::pop_front
                ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b8);
      std::__detail::
      _Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&local_68,&local_100);
      pVar6 = std::
              _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
              ::equal_range(local_c0,&local_100);
      for (_Var2._M_cur = (__node_type *)
                          pVar6.first.
                          super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                          ._M_cur;
          (_Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>)
          _Var2._M_cur !=
          pVar6.second.
          super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>.
          _M_cur.
          super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>;
          _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt) {
        pkVar1 = (key_type *)
                 ((long)&((_Var2._M_cur)->
                         super__Hash_node_value<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                         ._M_storage._M_storage + 0x10);
        iVar3 = std::
                _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&local_68,pkVar1);
        if (iVar3.super__Node_iterator_base<mir::inst::VarId,_true>._M_cur == (__node_type *)0x0) {
          std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                    ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b8,pkVar1)
          ;
        }
      }
      pVar6 = std::
              _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
              ::equal_range(local_c8,&local_100);
      for (_Var2._M_cur = (__node_type *)
                          pVar6.first.
                          super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                          ._M_cur;
          (_Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>)
          _Var2._M_cur !=
          pVar6.second.
          super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>.
          _M_cur.
          super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>;
          _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt) {
        _Var7 = std::__detail::
                _Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::insert((_Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this_00,
                         (value_type *)
                         ((long)&((_Var2._M_cur)->
                                 super__Hash_node_value<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                 ._M_storage._M_storage + 0x10));
        _Var8 = std::__detail::
                _Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::insert((_Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this_00,&local_100);
        bVar4 = bVar4 | _Var7.second | _Var8.second;
      }
    }
    std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::clear
              ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b8);
    p_Var5 = local_f0;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      local_100.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_100.id = (uint32_t)((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
      std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b8,&local_100)
      ;
    }
    while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_100.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_100.id = (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->id;
      std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::pop_front
                ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b8);
      _Var7 = std::__detail::
              _Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::insert((_Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)this_00,&local_100);
      pVar6 = std::
              _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
              ::equal_range(local_d0,&local_100);
      bVar4 = _Var7.second | bVar4;
      for (_Var2._M_cur = (__node_type *)
                          pVar6.first.
                          super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                          ._M_cur;
          (_Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>)
          _Var2._M_cur !=
          pVar6.second.
          super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>.
          _M_cur.
          super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>;
          _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt) {
        pkVar1 = (key_type *)
                 ((long)&((_Var2._M_cur)->
                         super__Hash_node_value<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                         ._M_storage._M_storage + 0x10);
        iVar3 = std::
                _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&this_00->_M_h,pkVar1);
        if (iVar3.super__Node_iterator_base<mir::inst::VarId,_true>._M_cur == (__node_type *)0x0) {
          std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                    ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_b8,pkVar1)
          ;
        }
      }
      iVar3 = std::
              _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(local_d8,&local_100);
      if (iVar3.super__Node_iterator_base<mir::inst::VarId,_true>._M_cur != (__node_type *)0x0) {
        _Var7 = std::__detail::
                _Insert_base<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::insert(local_e0,&local_100);
        bVar4 = bVar4 | _Var7.second;
      }
    }
  }
  std::
  _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  std::_Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Deque_base(&local_b8);
  return;
}

Assistant:

void ComplexDceRunner::calc_remained_vars() {
  // Add all stored variables to root vars
  std::deque<VarId> remaining;
  std::unordered_set<VarId> visited;

  bool changed = true;

  while (changed) {
    changed = false;

    remaining.clear();
    for (auto x : ref_vars) remaining.push_back(x);
    while (!remaining.empty()) {
      auto v = remaining.front();
      remaining.pop_front();
      visited.insert(v);
      for (auto [it, end] = invert_dependance.equal_range(v); it != end; it++) {
        if (visited.find(it->second) == visited.end()) {
          remaining.push_back(it->second);
        }
      }
      for (auto [it, end] = store_dependance.equal_range(v); it != end; it++) {
        changed |= do_not_delete.insert(it->second).second;
        changed |= do_not_delete.insert(v).second;
      }
    }

    // Add all dependant of root vars
    remaining.clear();
    for (auto x : do_not_delete) remaining.push_back(x);
    while (!remaining.empty()) {
      auto v = remaining.front();
      remaining.pop_front();
      changed |= do_not_delete.insert(v).second;
      for (auto [it, end] = var_dependance.equal_range(v); it != end; it++) {
        if (do_not_delete.find(it->second) == do_not_delete.end()) {
          remaining.push_back(it->second);
        }
      }
      if (backup_ref_vars.find(v) != backup_ref_vars.end()) {
        changed |= ref_vars.insert(v).second;
      }
    }
  }
}